

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void bgr_converter(uchar *from,uchar *to,int w,int delta)

{
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  uchar g;
  int iStack_1c;
  uchar r;
  int delta_local;
  int w_local;
  uchar *to_local;
  uchar *from_local;
  
  iStack_1c = w;
  _delta_local = to;
  to_local = from;
  while (iStack_1c != 0) {
    uVar1 = *to_local;
    uVar2 = to_local[1];
    *_delta_local = to_local[2];
    puVar3 = _delta_local + 2;
    _delta_local[1] = uVar2;
    _delta_local = _delta_local + 3;
    *puVar3 = uVar1;
    to_local = to_local + delta;
    iStack_1c = iStack_1c + -1;
  }
  return;
}

Assistant:

static void bgr_converter(const uchar *from, uchar *to, int w, int delta) {
  for (; w--; from += delta) {
    uchar r = from[0];
    uchar g = from[1];
    *to++ = from[2];
    *to++ = g;
    *to++ = r;
  }
}